

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

qsizetype accumulatedSize(QStringList *list,qsizetype seplen)

{
  long lVar1;
  QString *e;
  QString *pQVar2;
  long lVar3;
  
  lVar3 = (list->d).size;
  if (lVar3 != 0) {
    pQVar2 = (list->d).ptr;
    lVar1 = 0;
    for (lVar3 = lVar3 * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
      lVar1 = lVar1 + seplen + (pQVar2->d).size;
      pQVar2 = pQVar2 + 1;
    }
    return lVar1 - seplen;
  }
  return 0;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }